

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O2

bool __thiscall
QSystemSemaphorePosix::handle
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,AccessMode mode)

{
  uint uVar1;
  int iVar2;
  sem_t *psVar3;
  int *piVar4;
  int tryNum;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QLatin1String local_98;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = true;
  if (this->semaphore != (sem_t *)0x0) goto LAB_0043c491;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_70.d = (self->nativeKey).key.d.d;
  local_70.ptr = (self->nativeKey).key.d.ptr;
  local_70.size = (self->nativeKey).key.d.size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toLocal8Bit((QByteArray *)&local_58,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    QSystemSemaphore::tr((QString *)&local_88,"%1: key is empty",(char *)0x0,-1);
    local_98.m_size = 0x18;
    local_98.m_data = "QSystemSemaphore::handle";
    QString::arg<QLatin1String,_true>
              ((QString *)&local_70,(QString *)&local_88,&local_98,0,(QChar)0x20);
    self->error = KeyError;
    QString::operator=(&self->errorString,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_0043c484:
    bVar7 = false;
  }
  else {
    uVar1 = 1;
    uVar8 = 0xc0;
    for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
      do {
        pcVar6 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar6 = &QByteArray::_empty;
        }
        psVar3 = sem_open(pcVar6,(uint)uVar8,0x180,(ulong)(uint)self->initialValue);
        this->semaphore = (sem_t *)psVar3;
        if (psVar3 != (sem_t *)0x0) goto LAB_0043c465;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      if (*piVar4 != 0x11) goto LAB_0043c472;
      if (mode == Create) {
        pcVar6 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar6 = &QByteArray::_empty;
        }
        iVar2 = sem_unlink(pcVar6);
        if (iVar2 == -1) {
          uVar1 = 3;
          if (*piVar4 != 2) {
            function.m_data = "QSystemSemaphore::handle (sem_unlink)";
            function.m_size = 0x25;
            QSystemSemaphorePrivate::setUnixErrorString(self,function);
            goto LAB_0043c484;
          }
        }
        else {
          uVar1 = 3;
        }
      }
      else {
        uVar8 = (ulong)((uint)uVar8 & 0xffffff7f);
        uVar1 = 2;
      }
    }
    if (this->semaphore == (sem_t *)0x0) {
LAB_0043c472:
      function_00.m_data = "QSystemSemaphore::handle";
      function_00.m_size = 0x18;
      QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
      goto LAB_0043c484;
    }
LAB_0043c465:
    this->createdSemaphore = SUB81(uVar8 >> 7,0);
    bVar7 = true;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
LAB_0043c491:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QSystemSemaphorePosix::handle(QSystemSemaphorePrivate *self, QSystemSemaphore::AccessMode mode)
{
    if (semaphore != SEM_FAILED)
        return true;  // we already have a semaphore

    const QByteArray semName = QFile::encodeName(self->nativeKey.nativeKey());
    if (semName.isEmpty()) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: key is empty")
                       .arg("QSystemSemaphore::handle"_L1));
        return false;
    }

    // Always try with O_EXCL so we know whether we created the semaphore.
    int oflag = O_CREAT | O_EXCL;
    for (int tryNum = 0, maxTries = 1; tryNum < maxTries; ++tryNum) {
        do {
            semaphore = ::sem_open(semName.constData(), oflag, 0600, self->initialValue);
        } while (semaphore == SEM_FAILED && errno == EINTR);
        if (semaphore == SEM_FAILED && errno == EEXIST) {
            if (mode == QSystemSemaphore::Create) {
                if (::sem_unlink(semName.constData()) == -1 && errno != ENOENT) {
                    self->setUnixErrorString("QSystemSemaphore::handle (sem_unlink)"_L1);
                    return false;
                }
                // Race condition: the semaphore might be recreated before
                // we call sem_open again, so we'll retry several times.
                maxTries = 3;
            } else {
                // Race condition: if it no longer exists at the next sem_open
                // call, we won't realize we created it, so we'll leak it later.
                oflag &= ~O_EXCL;
                maxTries = 2;
            }
        } else {
            break;
        }
    }

    if (semaphore == SEM_FAILED) {
        self->setUnixErrorString("QSystemSemaphore::handle"_L1);
        return false;
    }

    createdSemaphore = (oflag & O_EXCL) != 0;

    return true;
}